

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandedAlign.h
# Opt level: O3

int __thiscall
BandedAlign<Protein>::Align
          (BandedAlign<Protein> *this,Sequence<Protein> *A,Sequence<Protein> *B,Cigar *cigar,
          AlignmentDirection dir,size_t startA,size_t startB,size_t endA,size_t endB)

{
  pointer piVar1;
  pointer pCVar2;
  int *piVar3;
  BandedAlignParams *pBVar4;
  ulong uVar5;
  pointer pGVar6;
  int iVar7;
  CigarOp CVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t remainingA;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  size_t length;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  value_type local_138;
  long local_128;
  long local_120;
  pointer local_118;
  ulong local_110;
  ulong local_108;
  pointer local_100;
  pointer local_f8;
  ulong local_f0;
  ulong local_e8;
  Sequence<Protein> *local_e0;
  Sequence<Protein> *local_d8;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_> local_b8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  pointer local_80;
  AlignmentDirection local_74;
  ulong local_70;
  ulong local_68;
  int *local_60;
  ulong local_58;
  BandedAlign<Protein> *local_50;
  ulong local_48;
  deque<CigarEntry,_std::allocator<CigarEntry>_> *local_40;
  allocator_type local_33;
  bool local_32;
  bool local_31;
  bool *pbVar12;
  
  uVar19 = (A->sequence)._M_string_length;
  uVar10 = (B->sequence)._M_string_length;
  local_58 = 0;
  uVar16 = 0;
  if (dir == Forward) {
    local_58 = uVar10;
    uVar16 = uVar19;
  }
  if (endA != 0xffffffffffffffff) {
    uVar16 = endA;
  }
  if (endB != 0xffffffffffffffff) {
    local_58 = endB;
  }
  local_a0 = startA;
  if (uVar19 < startA) {
    local_a0 = uVar19;
  }
  local_90 = startB;
  if (uVar10 < startB) {
    local_90 = uVar10;
  }
  local_88 = uVar19;
  if (uVar16 < uVar19) {
    local_88 = uVar16;
  }
  local_50 = (BandedAlign<Protein> *)uVar10;
  if (local_58 < uVar10) {
    local_50 = (BandedAlign<Protein> *)local_58;
  }
  local_70 = local_a0 - local_88;
  if (startA < local_88) {
    local_70 = local_88 - local_a0;
  }
  local_c0 = local_90 - (long)local_50;
  if (startB < local_50) {
    local_c0 = (long)local_50 - local_90;
  }
  local_48 = local_70 + 1;
  local_e0 = B;
  local_d8 = A;
  local_74 = dir;
  local_60 = (int *)startA;
  local_40 = &cigar->super_deque<CigarEntry,_std::allocator<CigarEntry>_>;
  if ((ulong)((long)(this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)(this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < local_48) {
    auVar23._8_4_ = (int)(local_48 >> 0x20);
    auVar23._0_8_ = local_48;
    auVar23._12_4_ = 0x45300000;
    dVar26 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) * 1.5;
    uVar5 = (ulong)dVar26;
    local_138.mScore = -0x40000000;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_b8,
               (long)(dVar26 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5,
               &local_138.mScore,&local_33);
    piVar1 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = &(local_b8.
                 super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                 ._M_impl.super__Vector_impl_data._M_start)->mScore;
    (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = &(local_b8.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->mScore;
    (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         &(local_b8.
           super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage)->mScore;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((piVar1 != (pointer)0x0) &&
       (operator_delete(piVar1),
       (CigarEntry)
       local_b8.
       super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
       _M_impl.super__Vector_impl_data._M_start != (CigarEntry)0x0)) {
      operator_delete(local_b8.
                      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_68 = local_c0 + 1;
  if ((ulong)((long)(this->mVerticalGaps).
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(this->mVerticalGaps).
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < local_48) {
    auVar24._8_4_ = (int)(local_48 >> 0x20);
    auVar24._0_8_ = local_48;
    auVar24._12_4_ = 0x45300000;
    dVar26 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)) * 1.5;
    uVar5 = (ulong)dVar26;
    local_138.mParams = &this->mParams;
    local_138.mScore = -0x40000000;
    local_138.mIsTerminal = false;
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::vector
              (&local_b8,(long)(dVar26 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5,
               &local_138,(allocator_type *)&local_33);
    pGVar6 = (this->mVerticalGaps).
             super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->mVerticalGaps).
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->mVerticalGaps).
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->mVerticalGaps).
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pGVar6 != (pointer)0x0) &&
       (operator_delete(pGVar6),
       (CigarEntry)
       local_b8.
       super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
       _M_impl.super__Vector_impl_data._M_start != (CigarEntry)0x0)) {
      operator_delete(local_b8.
                      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  uVar5 = local_68 * local_48;
  if ((ulong)((long)(this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start) < uVar5) {
    auVar25._8_4_ = (int)(uVar5 >> 0x20);
    auVar25._0_8_ = uVar5;
    auVar25._12_4_ = 0x45300000;
    dVar26 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 1.5;
    uVar5 = (ulong)dVar26;
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              ((vector<CigarOp,_std::allocator<CigarOp>_> *)&local_b8,
               (long)(dVar26 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5,
               (allocator_type *)&local_138);
    pCVar2 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_b8.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_b8.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_b8.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pCVar2 != (pointer)0x0) &&
       (operator_delete(pCVar2),
       (CigarEntry)
       local_b8.
       super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
       _M_impl.super__Vector_impl_data._M_start != (CigarEntry)0x0)) {
      operator_delete(local_b8.
                      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  piVar3 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c8 = (this->mParams).bandwidth;
  bVar11 = uVar10 <= startB || local_90 == 0;
  pbVar12 = (bool *)(ulong)bVar11;
  bVar21 = local_88 == 0;
  local_88 = CONCAT71(local_88._1_7_,bVar21);
  local_32 = uVar19 <= uVar16;
  local_31 = uVar10 <= local_58;
  *piVar3 = 0;
  local_80 = (this->mVerticalGaps).
             super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
             ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = -0x40000000;
  local_80->mScore = -0x40000000;
  local_80->mIsTerminal = false;
  pBVar4 = local_80->mParams;
  iVar13 = (&pBVar4->interiorGapOpenScore)[(ulong)bVar11 * 2] + *piVar3 +
           (&pBVar4->interiorGapExtendScore)[(ulong)bVar11 * 2];
  iVar15 = pBVar4->interiorGapExtendScore + -0x40000000;
  local_80->mScore = iVar15;
  if (iVar15 < iVar13) {
    local_80->mScore = iVar13;
    local_80->mIsTerminal = bVar11;
  }
  if (local_48 < 2) {
    uVar20 = 0;
    uVar19 = 1;
  }
  else {
    bVar11 = uVar19 <= local_60 || local_a0 == 0;
    uVar16 = (ulong)((uint)bVar11 * 8);
    pCVar2 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar12 = &local_80[1].mIsTerminal;
    uVar20 = 0;
    uVar10 = 1;
    do {
      if ((local_c8 < uVar10) && (1 < local_68)) {
        piVar3[uVar10] = -0x40000000;
        ((Gap *)(pbVar12 + -4))->mScore = -0x40000000;
        *pbVar12 = false;
        goto LAB_0015f8b7;
      }
      iVar15 = *(int *)((long)&(this->mParams).interiorGapOpenScore + uVar16) + piVar3[uVar10 - 1] +
               *(int *)((long)&(this->mParams).interiorGapExtendScore + uVar16);
      iVar13 = iVar7 + (&(this->mParams).interiorGapExtendScore)[(ulong)uVar20 * 2];
      iVar7 = iVar13;
      if (iVar13 < iVar15) {
        iVar7 = iVar15;
      }
      if (iVar13 < iVar15) {
        uVar20 = (uint)bVar11;
      }
      piVar3[uVar10] = iVar7;
      pCVar2[uVar10] = Insertion;
      ((Gap *)(pbVar12 + -4))->mScore = -0x40000000;
      *pbVar12 = false;
      pbVar12 = pbVar12 + 0x10;
      bVar22 = uVar10 != local_70;
      uVar10 = uVar10 + 1;
      uVar19 = local_48;
    } while (bVar22);
  }
  uVar10 = 1;
  if (1 < local_68) {
LAB_0015f8b7:
    local_32 = local_32 || bVar21;
    local_31 = local_31 || local_50 == (BandedAlign<Protein> *)0x0;
    local_d0 = local_90 - 1;
    uVar10 = 1;
    uVar16 = local_48;
    do {
      local_f0 = uVar16;
      local_98 = uVar10;
      local_e8 = local_98 - local_c8;
      if (local_98 < local_c8) {
        local_e8 = 0;
      }
      if (local_70 < local_e8) {
        local_e8 = local_70;
      }
      uVar10 = local_c8 + local_98;
      local_58 = uVar10;
      if (local_70 < uVar10) {
        local_58 = local_70;
      }
      iVar13 = -0x40000000;
      if (local_e8 != 0) {
        iVar13 = piVar3[local_e8 - 1];
        piVar3[local_e8 - 1] = -0x40000000;
        local_80[local_e8 - 1].mScore = -0x40000000;
        local_80[local_e8 - 1].mIsTerminal = false;
      }
      uVar19 = local_e8;
      if (uVar10 < local_e8) {
        iVar7 = -0x40000000;
        uVar20 = 0;
      }
      else {
        uVar16 = local_a0 - local_e8;
        pGVar6 = local_80 + local_e8;
        uVar10 = local_90 - local_98;
        if (local_74 == Forward) {
          uVar10 = local_d0 + local_98;
        }
        local_100 = (local_d8->sequence)._M_dataplus._M_p;
        local_110 = (local_d8->sequence)._M_string_length;
        local_f8 = (local_e0->sequence)._M_dataplus._M_p;
        local_108 = (local_e0->sequence)._M_string_length;
        bVar11 = local_98 == local_c0 && local_31;
        uVar5 = (ulong)((uint)bVar11 * 8);
        local_120 = uVar5 + 8;
        local_128 = uVar5 + 0xc;
        local_118 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_start + local_f0;
        iVar15 = -0x40000000;
        uVar20 = 0;
        iVar7 = -0x40000000;
        do {
          local_88 = (ulong)bVar11;
          if (uVar19 != 0) {
            uVar9 = (local_a0 - 1) + uVar19;
            if (local_74 != Forward) {
              uVar9 = uVar16;
            }
            if ((local_110 <= uVar9) || (local_108 <= uVar10)) {
              local_60 = piVar3;
              local_50 = this;
              __assert_fail("index >= 0 && index < sequence.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Sequence.h"
                            ,0x32,
                            "char Sequence<Protein>::operator[](const size_t) const [Alphabet = Protein]"
                           );
            }
            pbVar12 = (bool *)(ulong)(3 < "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                                          [(long)local_f8[uVar10] +
                                           (long)local_100[uVar9] * 0x1a + 0x15]);
            iVar15 = iVar13 + "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [(long)local_f8[uVar10] + (long)local_100[uVar9] * 0x1a + 0x15];
          }
          if (iVar15 <= iVar7) {
            iVar15 = iVar7;
          }
          if (iVar15 <= pGVar6->mScore) {
            iVar15 = pGVar6->mScore;
          }
          iVar13 = piVar3[uVar19];
          piVar3[uVar19] = iVar15;
          CVar8 = Mismatch;
          if (((ulong)pbVar12 & 1) != 0) {
            CVar8 = Match;
          }
          iVar14 = pGVar6->mScore;
          if (iVar15 == iVar14) {
            CVar8 = Deletion;
          }
          if (iVar15 == iVar7) {
            CVar8 = Insertion;
          }
          local_118[uVar19] = CVar8;
          bVar21 = (local_70 == uVar19 || uVar19 == 0) && local_32;
          iVar17 = *(int *)((long)&(this->mParams).interiorGapOpenScore + uVar5) + iVar15 +
                   *(int *)((long)&(this->mParams).interiorGapExtendScore + uVar5);
          iVar18 = iVar7 + (&(this->mParams).interiorGapExtendScore)[(ulong)uVar20 * 2];
          iVar7 = iVar18;
          if (iVar18 < iVar17) {
            iVar7 = iVar17;
          }
          local_88._0_4_ = (uint)bVar11;
          if (iVar18 < iVar17) {
            uVar20 = (uint)local_88;
          }
          pBVar4 = pGVar6->mParams;
          uVar9 = (ulong)bVar21;
          iVar18 = (&pBVar4->interiorGapOpenScore)[uVar9 * 2] + iVar15 +
                   (&pBVar4->interiorGapExtendScore)[uVar9 * 2];
          iVar14 = iVar14 + (&pBVar4->interiorGapExtendScore)[(ulong)pGVar6->mIsTerminal * 2];
          pGVar6->mScore = iVar14;
          if (iVar14 < iVar18) {
            pGVar6->mScore = iVar18;
            pGVar6->mIsTerminal = bVar21;
          }
          uVar19 = uVar19 + 1;
          uVar16 = uVar16 - 1;
          pGVar6 = pGVar6 + 1;
        } while (uVar19 <= local_58);
      }
      uVar10 = local_58 + 1;
      if (uVar10 < local_48) {
        piVar3[local_58 + 1] = -0x40000000;
        local_80[uVar10].mScore = -0x40000000;
        local_80[uVar10].mIsTerminal = false;
      }
      uVar10 = local_98 + 1;
    } while ((uVar10 < local_68) && (uVar16 = local_f0 + local_48, local_58 != local_e8));
  }
  local_70 = uVar19 - 1;
  local_60 = piVar3;
  local_50 = this;
  if (local_40 != (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) {
    uVar16 = uVar10 - 1;
    local_98 = uVar10;
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::clear(local_40);
    uVar10 = local_70;
    if (local_70 != 0 || uVar16 != 0) {
      do {
        CVar8 = (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10 + uVar16 * local_48];
        local_b8.
        super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
        _M_impl.super__Vector_impl_data._M_start._0_5_ = CONCAT14(CVar8,1);
        local_58 = uVar16;
        Cigar::Add((Cigar *)local_40,(CigarEntry *)&local_b8);
        uVar16 = local_58;
        if (CVar8 < Insertion) {
          if (CVar8 == Match) {
LAB_0015fc93:
            uVar10 = uVar10 + -1;
            uVar16 = local_58 - 1;
          }
          else if (CVar8 == Deletion) {
            uVar16 = local_58 - 1;
          }
        }
        else {
          if (CVar8 == Mismatch) goto LAB_0015fc93;
          if (CVar8 == Insertion) {
            uVar10 = uVar10 + -1;
          }
        }
        this = local_50;
      } while (uVar10 != 0 || uVar16 != 0);
    }
    Cigar::Reverse((Cigar *)local_40);
    local_60 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar10 = local_98;
  }
  uVar16 = local_70;
  iVar13 = local_60[uVar19 - 1];
  if (local_48 - uVar19 == 0) {
    length = local_68 - uVar10;
    pGVar6 = (this->mVerticalGaps).
             super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Gap::OpenOrExtend(pGVar6 + local_70,iVar13,pGVar6[local_70].mIsTerminal,length);
    iVar13 = pGVar6[uVar16].mScore;
    if ((local_40 == (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) || (local_68 == uVar10))
    goto LAB_0015fd80;
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start._0_5_ = CONCAT14(Deletion,(int)length);
  }
  else {
    if (local_68 != uVar10) goto LAB_0015fd80;
    iVar14 = (int)(local_48 - uVar19);
    iVar18 = (&(this->mParams).interiorGapExtendScore)[(ulong)uVar20 * 2] * iVar14;
    iVar15 = iVar13 + (&(this->mParams).interiorGapOpenScore)[(ulong)uVar20 * 2] + iVar18;
    iVar13 = iVar18 + iVar7;
    if (iVar13 < iVar15) {
      iVar13 = iVar15;
    }
    if (local_40 == (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) {
      return iVar13;
    }
    local_b8.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start._0_5_ = CONCAT14(Insertion,iVar14);
  }
  Cigar::Add((Cigar *)local_40,(CigarEntry *)&local_b8);
LAB_0015fd80:
  if (local_74 == Reverse && local_40 != (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) {
    Cigar::Reverse((Cigar *)local_40);
  }
  return iVar13;
}

Assistant:

int Align( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
             Cigar*                   cigar = NULL,
             const AlignmentDirection dir   = AlignmentDirection::Forward,
             size_t startA = 0, size_t startB = 0, size_t endA = -1,
             size_t endB = -1 ) {
    // Calculate matrix width, depending on alignment
    // direction and length of sequences
    // A will be on the X axis (width of matrix)
    // B will be on the Y axis (height of matrix)
    size_t width, height;

    size_t lenA = A.Length();
    size_t lenB = B.Length();

    if( endA == ( size_t ) -1 ) {
      endA = ( dir == AlignmentDirection::Forward ? lenA : 0 );
    }

    if( endB == ( size_t ) -1 ) {
      endB = ( dir == AlignmentDirection::Forward ? lenB : 0 );
    }

    if( startA > lenA )
      startA = lenA;
    if( startB > lenB )
      startB = lenB;
    if( endA > lenA )
      endA = lenA;
    if( endB > lenB )
      endB = lenB;

    width  = ( endA > startA ? endA - startA : startA - endA ) + 1;
    height = ( endB > startB ? endB - startB : startB - endB ) + 1;

    // Make sure we have enough cells
    if( mScores.capacity() < width ) {
      mScores = Scores( width * 1.5, MinInt() );
    }

    if( mVerticalGaps.capacity() < width ) {
      mVerticalGaps = Gaps( width * 1.5, mParams );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    // Initialize first row
    size_t bw = mParams.bandwidth;

    bool fromBeginningA = ( startA == 0 || startA == lenA );
    bool fromBeginningB = ( startB == 0 || startB == lenB );

    bool fromEndA = ( endA == 0 || endA == lenA );
    bool fromEndB = ( endB == 0 || endB == lenB );

    mScores[ 0 ] = 0;

    mVerticalGaps[ 0 ].Reset();
    mVerticalGaps[ 0 ].OpenOrExtend( mScores[ 0 ], fromBeginningB );

    Gap horizontalGap( mParams );

    size_t x, y;
    for( x = 1; x < width; x++ ) {
      if( x > bw && height > 1 ) // only break on BW bound if B is not empty
        break;

      horizontalGap.OpenOrExtend( mScores[ x - 1 ], fromBeginningA );
      mScores[ x ]     = horizontalGap.Score();
      mOperations[ x ] = CigarOp::Insertion;
      mVerticalGaps[ x ].Reset();
    }
    if( x < width ) {
      mScores[ x ] = MinInt();
      mVerticalGaps[ x ].Reset();
    }
    /* PrintRow( width ); */

    // Row by row...
    size_t center = 1;
    bool   hitEnd = false;
    for( y = 1; y < height && !hitEnd; y++ ) {
      int score = MinInt();

      // Calculate band bounds
      size_t leftBound =
        std::min( center > bw ? ( center - bw ) : 0, width - 1 );
      size_t rightBound = std::min( center + bw, width - 1 );

      // Set diagonal score for first calculated cell in row
      int diagScore = MinInt();
      if( leftBound > 0 ) {
        diagScore                = mScores[ leftBound - 1 ];
        mScores[ leftBound - 1 ] = MinInt();
        mVerticalGaps[ leftBound - 1 ].Reset();
      }

      // Calculate row within the band bounds
      horizontalGap.Reset();
      for( x = leftBound; x <= rightBound; x++ ) {
        // Calculate diagonal score
        size_t aIdx = 0, bIdx = 0;
        bool   match;
        if( x > 0 ) {
          aIdx =
            ( dir == AlignmentDirection::Forward ) ? startA + x - 1 : startA - x;
          bIdx =
            ( dir == AlignmentDirection::Forward ) ? startB + y - 1 : startB - y;
          // diagScore: score at col-1, row-1
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // Select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < horizontalGap.Score() )
          score = horizontalGap.Score();

        Gap& verticalGap = mVerticalGaps[ x ];
        if( score < verticalGap.Score() )
          score = verticalGap.Score();

        // Save the prev score at (x - 1) which
        // we will use to compute the diagonal score at (x)
        diagScore = mScores[ x ];

        // Save new score
        mScores[ x ] = score;

        CigarOp op;
        if( score == horizontalGap.Score() ) {
          op = CigarOp::Insertion;
        } else if( score == verticalGap.Score() ) {
          op = CigarOp::Deletion;
        } else {
          op = match ? CigarOp::Match : CigarOp::Mismatch;
        }
        mOperations[ y * width + x ] = op;

        // Calculate potential gaps
        bool isTerminalA = ( x == 0 || x == width - 1 ) && fromEndA;
        bool isTerminalB = ( y == 0 || y == height - 1 ) && fromEndB;

        horizontalGap.OpenOrExtend( score, isTerminalB );
        verticalGap.OpenOrExtend( score, isTerminalA );
      }

      if( rightBound + 1 < width ) {
        mScores[ rightBound + 1 ] = MinInt();
        mVerticalGaps[ rightBound + 1 ].Reset();
      }

      hitEnd = ( rightBound == leftBound );

      /* PrintRow( width ); */

      // Move one cell over for the next row
      center++;
    }

    // Backtrack
    if( cigar ) {
      size_t bx = x - 1;
      size_t by = y - 1;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      cigar->Reverse();
    }

    // Calculate score & cut corners
    int score = mScores[ x - 1 ];
    if( x == width ) {
      // We reached the end of A, emulate going down on B (vertical gaps)
      size_t remainingB  = height - y;
      Gap&   verticalGap = mVerticalGaps[ x - 1 ];
      verticalGap.OpenOrExtend( score, verticalGap.IsTerminal(), remainingB );
      score = verticalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingB ) {
        cigar->Add( CigarEntry( remainingB, CigarOp::Deletion ) );
      }
    } else if( y == height ) {
      // We reached the end of B, emulate going down on A (horizontal gaps)
      size_t remainingA = width - x;
      horizontalGap.OpenOrExtend( score, horizontalGap.IsTerminal(),
                                  remainingA );
      score = horizontalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingA ) {
        cigar->Add( CigarEntry( remainingA, CigarOp::Insertion ) );
      }
    }

    if( cigar && dir == AlignmentDirection::Reverse ) {
      cigar->Reverse();
    }

    return score;
  }